

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::service_call_args_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc)

{
  int iVar1;
  undefined4 extraout_var;
  string sStack_58;
  string local_38;
  
  rust_camel_case(&local_38,this,&(this->super_t_generator).service_name_);
  iVar1 = (*(tfunc->arglist_->super_t_type).super_t_doc._vptr_t_doc[3])();
  rust_camel_case(&sStack_58,this,(string *)CONCAT44(extraout_var,iVar1));
  std::operator+(__return_storage_ptr__,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::service_call_args_struct_name(t_function* tfunc) {
  // Thrift automatically appends `Args` to the arglist name. No need to do it here.
  return rust_camel_case(service_name_) + rust_camel_case(tfunc->get_arglist()->get_name());
}